

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O1

gnode_t * parse_function(gravity_parser_t *parser,_Bool is_declaration,gtoken_t access_specifier,
                        gtoken_t storage_specifier)

{
  gravity_lexer_t *lexer;
  size_t sVar1;
  gnode_r *pgVar2;
  gtoken_s token_00;
  _Bool _Var3;
  gtoken_t gVar4;
  gtoken_t gVar5;
  char *pcVar6;
  gnode_t *pgVar7;
  gnode_r *pgVar8;
  gnode_t **ppgVar9;
  gnode_t *pgVar10;
  size_t sVar11;
  bool bVar12;
  gtoken_s token;
  _Bool has_default_values;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  char *local_68;
  _Bool local_58;
  undefined7 uStack_57;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  char *local_38;
  
  lexer = parser->lexer->p[parser->lexer->n - 1];
  gVar4 = gravity_lexer_peek(lexer);
  gravity_lexer_token(lexer);
  if (gVar4 != TOK_OP_OPEN_CURLYBRACE) {
    gVar5 = gravity_lexer_next(lexer);
    gravity_lexer_token(lexer);
    local_68 = local_38;
    local_88 = CONCAT71(uStack_57,local_58);
    local_78 = local_48;
    uStack_70 = uStack_40;
    uStack_80 = uStack_50;
    if (gVar5 != TOK_KEY_FUNC) {
      report_error(parser,GRAVITY_ERROR_SYNTAX,0x144449);
      return (gnode_t *)0x0;
    }
  }
  if (is_declaration) {
    gVar5 = gravity_lexer_peek(lexer);
    _Var3 = token_isoperator(gVar5);
    if (_Var3) {
      gVar5 = gravity_lexer_next(lexer);
      pcVar6 = token_name(gVar5);
      pcVar6 = string_dup(pcVar6);
    }
    else {
      pcVar6 = parse_identifier(parser);
    }
  }
  else {
    pcVar6 = (char *)0x0;
  }
  sVar1 = parser->declarations->n;
  if (sVar1 == 0) {
    pgVar7 = (gnode_t *)0x0;
  }
  else {
    pgVar7 = parser->declarations->p[sVar1 - 1];
  }
  token_00.colno = (int)uStack_80;
  token_00.type = (undefined4)local_88;
  token_00.lineno = local_88._4_4_;
  token_00.position = (int)((ulong)uStack_80 >> 0x20);
  token_00.bytes = (int)local_78;
  token_00.length = (int)((ulong)local_78 >> 0x20);
  token_00.fileid = (int)uStack_70;
  token_00.builtin = (int)((ulong)uStack_70 >> 0x20);
  token_00.value = local_68;
  pgVar7 = gnode_function_decl_create
                     (token_00,pcVar6,access_specifier,storage_specifier,(gnode_r *)0x0,
                      (gnode_compound_stmt_t *)0x0,pgVar7);
  if (gVar4 != TOK_OP_OPEN_CURLYBRACE) {
    parse_required(parser,TOK_OP_OPEN_PARENTHESIS);
  }
  local_58 = false;
  pgVar8 = parse_optional_parameter_declaration(parser,gVar4 == TOK_OP_OPEN_CURLYBRACE,&local_58);
  if (gVar4 != TOK_OP_OPEN_CURLYBRACE) {
    parse_required(parser,TOK_OP_CLOSED_PARENTHESIS);
  }
  pgVar2 = parser->declarations;
  sVar1 = pgVar2->m;
  if (pgVar2->n == sVar1) {
    sVar11 = 8;
    if (sVar1 != 0) {
      sVar11 = sVar1 * 2;
    }
    pgVar2->m = sVar11;
    ppgVar9 = (gnode_t **)realloc(pgVar2->p,sVar11 << 3);
    parser->declarations->p = ppgVar9;
  }
  pgVar2 = parser->declarations;
  sVar1 = pgVar2->n;
  pgVar2->n = sVar1 + 1;
  pgVar2->p[sVar1] = pgVar7;
  pgVar10 = parse_compound_statement(parser);
  parser->declarations->n = parser->declarations->n - 1;
  sVar1 = (parser->vdecl).n;
  if (sVar1 == 0) {
    *(undefined1 *)((long)&pgVar7[1].token.value + 5) = 0;
  }
  else {
    bVar12 = (parser->vdecl).p[sVar1 - 1] == 1;
    *(bool *)((long)&pgVar7[1].token.value + 5) = bVar12;
    if (bVar12) goto LAB_0011a5c5;
  }
  parse_semicolon(parser);
LAB_0011a5c5:
  *(_Bool *)((long)&pgVar7[1].token.value + 4) = local_58;
  *(gnode_r **)&pgVar7[1].token.bytes = pgVar8;
  *(gnode_t **)&pgVar7[1].token.fileid = pgVar10;
  return pgVar7;
}

Assistant:

gnode_t *parse_function (gravity_parser_t *parser, bool is_declaration, gtoken_t access_specifier, gtoken_t storage_specifier) {
    DECLARE_LEXER;

    // access_specifier? storage_specifier? already parsed
    // 'function' IDENTIFIER '(' parameter_declaration_clause? ')' compound_statement

    // consume FUNC keyword (or peek for OPEN_CURLYBRACE)
    bool is_implicit = (gravity_lexer_peek(lexer) == TOK_OP_OPEN_CURLYBRACE);
    gtoken_s token = gravity_lexer_token(lexer);
    if (!is_implicit) {
        gtoken_t type = gravity_lexer_next(lexer);
        token = gravity_lexer_token(lexer);
        if (type != TOK_KEY_FUNC) {
            REPORT_ERROR(token, "Invalid function expression.");
            return NULL;
        }
    }

    // parse IDENTIFIER
    const char *identifier = NULL;
    if (is_declaration) {
        gtoken_t peek = gravity_lexer_peek(lexer);
        identifier = (token_isoperator(peek)) ? string_dup(token_name(gravity_lexer_next(lexer))) : parse_identifier(parser);
        DEBUG_PARSER("parse_function_declaration %s", identifier);
    }

    // create func declaration node
    gnode_function_decl_t *func = (gnode_function_decl_t *) gnode_function_decl_create(token, identifier, access_specifier, storage_specifier, NULL, NULL, LAST_DECLARATION());

    // check and consume TOK_OP_OPEN_PARENTHESIS
    if (!is_implicit) parse_required(parser, TOK_OP_OPEN_PARENTHESIS);

    // parse optional parameter declaration clause
    bool has_default_values = false;
    gnode_r *params = parse_optional_parameter_declaration(parser, is_implicit, &has_default_values);

    // check and consume TOK_OP_CLOSED_PARENTHESIS
    if (!is_implicit) parse_required(parser, TOK_OP_CLOSED_PARENTHESIS);

    // parse compound statement
    PUSH_DECLARATION(func);
    gnode_compound_stmt_t *compound = (gnode_compound_stmt_t*)parse_compound_statement(parser);
    POP_DECLARATION();

    // if func is declarared inside a variable declaration node then the semicolon check must be
    // performed once at variable declaration node level ad not inside the func node
    bool is_inside_var_declaration = ((marray_size(parser->vdecl) > 0) && (marray_last(parser->vdecl) == 1));
    func->is_closure = is_inside_var_declaration;
    
    // parse optional semicolon
    if (!is_inside_var_declaration) parse_semicolon(parser);

    // finish func setup
    func->has_defaults = has_default_values;
    func->params = params;
    func->block = compound;
    return (gnode_t *)func;
}